

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void load_persons(storage_t *st)

{
  int iVar1;
  bool bVar2;
  person_t p;
  
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    gen_person(&p);
    e2e_fdb_set_person(st,&p);
  }
  return;
}

Assistant:

void load_persons(storage_t *st) {
    int i, n=100;
    person_t p;

    // store and index person docs
    for (i = 0; i < n; ++i) {
        gen_person(&p);
        e2e_fdb_set_person(st, &p);
    }

#ifdef __DEBUG_E2E
    printf("[%s] load persons: %03d docs created\n",st->keyspace, n);
#endif
}